

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscription.cpp
# Opt level: O3

void __thiscall
aeron::Subscription::Subscription
          (Subscription *this,ClientConductor *conductor,int64_t registrationId,string *channel,
          int32_t streamId,int32_t channelStatusId)

{
  pointer pcVar1;
  __pointer_type pIVar2;
  undefined8 *puVar3;
  
  this->_vptr_Subscription = (_func_int **)&PTR__Subscription_00163cd8;
  this->m_conductor = conductor;
  (this->m_channel)._M_dataplus._M_p = (pointer)&(this->m_channel).field_2;
  pcVar1 = (channel->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_channel,pcVar1,pcVar1 + channel->_M_string_length);
  this->m_channelStatusId = channelStatusId;
  this->m_roundRobinIndex = 0;
  this->m_registrationId = registrationId;
  this->m_streamId = streamId;
  pIVar2 = (__pointer_type)operator_new(0x10);
  puVar3 = (undefined8 *)operator_new__(8);
  *puVar3 = 0;
  pIVar2->m_images = (Image *)(puVar3 + 1);
  pIVar2->m_length = 0;
  (this->m_imageList)._M_b._M_p = pIVar2;
  (this->m_isClosed)._M_base._M_i = false;
  return;
}

Assistant:

Subscription::Subscription(
    ClientConductor &conductor,
    std::int64_t registrationId,
    const std::string &channel,
    std::int32_t streamId,
    std::int32_t channelStatusId) :
    m_conductor(conductor),
    m_channel(channel),
    m_channelStatusId(channelStatusId),
    m_registrationId(registrationId),
    m_streamId(streamId),
    m_imageList(new struct ImageList(new Image[0], 0)),
    m_isClosed(false)
{
}